

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall
QComboBoxPrivateContainer::QComboBoxPrivateContainer
          (QComboBoxPrivateContainer *this,QAbstractItemView *itemView,QComboBox *parent)

{
  long lVar1;
  int iVar2;
  ContextType *sender;
  QStyle *pQVar3;
  void *pvVar4;
  QBoxLayout *in_RDX;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  bool usePopup;
  QBoxLayout *layout;
  QStyleOptionComboBox opt;
  undefined4 in_stack_fffffffffffffe68;
  WindowType in_stack_fffffffffffffe6c;
  QStyleOptionComboBox *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  QFlagsStorage<Qt::AlignmentFlag> in_stack_fffffffffffffe7c;
  QWidget *in_stack_fffffffffffffe80;
  QComboBoxPrivateContainer *in_stack_fffffffffffffe88;
  QComboBoxPrivateScroller *in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffe98;
  QWidget *in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffea8;
  int index;
  ContextType *context;
  undefined8 in_stack_fffffffffffffed0;
  QWidget *in_stack_fffffffffffffed8;
  code *in_stack_fffffffffffffee0;
  ConnectionType type;
  QBoxLayout *pQVar5;
  Connection local_d8;
  undefined4 local_cc;
  code *local_c8;
  undefined8 local_c0;
  Connection local_b8;
  undefined4 local_b0;
  QAbstractItemView *in_stack_ffffffffffffff60;
  QComboBoxPrivateContainer *in_stack_ffffffffffffff68;
  
  index = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = in_RDX;
  QFlags<Qt::WindowType>::QFlags
            ((QFlags<Qt::WindowType> *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
  QFrame::QFrame((QFrame *)in_stack_fffffffffffffe80,
                 (QWidget *)CONCAT44(in_stack_fffffffffffffe7c.i,in_stack_fffffffffffffe78),
                 (QFlagsStorageHelper<Qt::WindowType,_4>)
                 SUB84((ulong)in_stack_fffffffffffffe88 >> 0x20,0));
  *in_RDI = &PTR_metaObject_00d10878;
  in_RDI[2] = &PTR__QComboBoxPrivateContainer_00d10a30;
  QTimer::QTimer((QTimer *)(in_RDI + 5),(QObject *)0x0);
  QBasicTimer::QBasicTimer((QBasicTimer *)(in_RDI + 7));
  QPoint::QPoint((QPoint *)in_stack_fffffffffffffe70);
  in_RDI[9] = pQVar5;
  in_RDI[10] = 0;
  in_RDI[0xb] = 0;
  in_RDI[0xc] = 0;
  QElapsedTimer::QElapsedTimer((QElapsedTimer *)(in_RDI + 0xd));
  type = (ConnectionType)pQVar5;
  *(undefined1 *)(in_RDI + 0xf) = 0;
  QWidget::setAttribute
            (in_stack_fffffffffffffed8,(WidgetAttribute)((ulong)in_stack_fffffffffffffed0 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffed0 >> 0x18,0));
  QWidget::setAttribute
            (in_stack_fffffffffffffed8,(WidgetAttribute)((ulong)in_stack_fffffffffffffed0 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffed0 >> 0x18,0));
  QTimer::setSingleShot((bool)((char)in_RDI + '('));
  sender = (ContextType *)operator_new(0x20);
  QBoxLayout::QBoxLayout
            ((QBoxLayout *)in_stack_fffffffffffffe90,
             (Direction)((ulong)in_stack_fffffffffffffe88 >> 0x20),in_stack_fffffffffffffe80);
  context = sender;
  (**(code **)(*(long *)&(sender->super_QFrame).super_QWidget + 0x68))(sender,0);
  QMargins::QMargins((QMargins *)in_stack_fffffffffffffe70);
  QLayout::setContentsMargins
            ((QLayout *)in_stack_fffffffffffffe80,
             (QMargins *)CONCAT44(in_stack_fffffffffffffe7c.i,in_stack_fffffffffffffe78));
  setItemView(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  memset(&stack0xffffffffffffff68,0xaa,0x90);
  comboStyleOption(in_stack_fffffffffffffe88);
  pQVar3 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x19,&stack0xffffffffffffff68,in_RDI[9],0);
  if (iVar2 == 0) {
    QFrame::setLineWidth((QFrame *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
  }
  else {
    in_stack_fffffffffffffea0 = (QWidget *)operator_new(0x38);
    QComboBoxPrivateScroller::QComboBoxPrivateScroller
              (in_stack_fffffffffffffe90,(SliderAction)((ulong)in_stack_fffffffffffffe88 >> 0x20),
               in_stack_fffffffffffffe80);
    in_RDI[0xb] = in_stack_fffffffffffffea0;
    pvVar4 = operator_new(0x38);
    QComboBoxPrivateScroller::QComboBoxPrivateScroller
              (in_stack_fffffffffffffe90,(SliderAction)((ulong)in_stack_fffffffffffffe88 >> 0x20),
               in_stack_fffffffffffffe80);
    in_RDI[0xc] = pvVar4;
    QWidget::hide((QWidget *)0x53353c);
    index = (int)((ulong)pvVar4 >> 0x20);
    QWidget::hide((QWidget *)0x53354a);
  }
  if (in_RDI[0xb] != 0) {
    in_stack_fffffffffffffe98 = in_RDI[0xb];
    local_b0 = 0;
    QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x53359e);
    QBoxLayout::insertWidget
              (in_RDX,index,in_stack_fffffffffffffea0,
               (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
               (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)context >> 0x20,0));
    local_c8 = scrollItemView;
    local_c0 = 0;
    in_stack_fffffffffffffee0 = QComboBoxPrivateScroller::doScroll;
    in_stack_fffffffffffffe68 = 0;
    QObject::connect<void(QComboBoxPrivateScroller::*)(int),void(QComboBoxPrivateContainer::*)(int)>
              ((Object *)sender,0x533d50,context,
               (offset_in_QComboBoxPrivateContainer_to_subr *)in_RDX,type);
    QMetaObject::Connection::~Connection(&local_b8);
  }
  if (in_RDI[0xc] != 0) {
    in_stack_fffffffffffffe88 = (QComboBoxPrivateContainer *)in_RDI[0xc];
    local_cc = 0;
    QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x533670);
    QBoxLayout::addWidget
              ((QBoxLayout *)in_stack_fffffffffffffe70,
               (QWidget *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),0,
               (Alignment)in_stack_fffffffffffffe7c.i);
    QObject::connect<void(QComboBoxPrivateScroller::*)(int),void(QComboBoxPrivateContainer::*)(int)>
              ((Object *)sender,
               (offset_in_QComboBoxPrivateScroller_to_subr)in_stack_fffffffffffffee0,context,
               (offset_in_QComboBoxPrivateContainer_to_subr *)in_RDX,type);
    QMetaObject::Connection::~Connection(&local_d8);
  }
  QBoxLayout::insertSpacing
            ((QBoxLayout *)in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20)
             ,(int)in_stack_fffffffffffffe98);
  QBoxLayout::addSpacing((QBoxLayout *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
  updateStyleSettings(in_stack_fffffffffffffe88);
  QStyleOptionComboBox::~QStyleOptionComboBox(in_stack_fffffffffffffe70);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QComboBoxPrivateContainer::QComboBoxPrivateContainer(QAbstractItemView *itemView, QComboBox *parent)
    : QFrame(parent, Qt::Popup), combo(parent)
{
    // we need the combobox and itemview
    Q_ASSERT(parent);
    Q_ASSERT(itemView);

    setAttribute(Qt::WA_WindowPropagation);
    setAttribute(Qt::WA_X11NetWmWindowTypeCombo);

    // setup container
    blockMouseReleaseTimer.setSingleShot(true);

    // we need a vertical layout
    QBoxLayout *layout =  new QBoxLayout(QBoxLayout::TopToBottom, this);
    layout->setSpacing(0);
    layout->setContentsMargins(QMargins());

    // set item view
    setItemView(itemView);

    // add scroller arrows if style needs them
    QStyleOptionComboBox opt = comboStyleOption();
    const bool usePopup = combo->style()->styleHint(QStyle::SH_ComboBox_Popup, &opt, combo);
    if (usePopup) {
        top = new QComboBoxPrivateScroller(QAbstractSlider::SliderSingleStepSub, this);
        bottom = new QComboBoxPrivateScroller(QAbstractSlider::SliderSingleStepAdd, this);
        top->hide();
        bottom->hide();
    } else {
        setLineWidth(1);
    }

    if (top) {
        layout->insertWidget(0, top);
        connect(top, &QComboBoxPrivateScroller::doScroll,
                this, &QComboBoxPrivateContainer::scrollItemView);
    }
    if (bottom) {
        layout->addWidget(bottom);
        connect(bottom, &QComboBoxPrivateScroller::doScroll,
                this, &QComboBoxPrivateContainer::scrollItemView);
    }

    // Some styles (Mac) have a margin at the top and bottom of the popup.
    layout->insertSpacing(0, 0);
    layout->addSpacing(0);
    updateStyleSettings();
}